

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.c
# Opt level: O1

int readline(char *pl)

{
  ushort *puVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  byte bVar6;
  char *pcVar7;
  ulong uVar8;
  
  if (c == -1) {
    return 0;
  }
  if (c != -1) {
    do {
      c = l;
      l = fgetc((FILE *)f);
      if (c < 9) {
        if (c == -1) {
          if (mlc == 1) {
            err(E,"unterminated comment");
          }
        }
        else {
LAB_00106653:
          bVar6 = c == 0x2f & (mlc ^ 1) ^ 1;
          if (l == 0x2f && bVar6 == 0) {
            while ((0xd < (uint)l || ((0x2c00U >> (l & 0x1fU) & 1) == 0))) {
              c = l;
              l = fgetc((FILE *)f);
            }
          }
          else if (l == 0x2a && bVar6 == 0) {
            c = l;
            l = fgetc((FILE *)f);
            pl[0] = ' ';
            pl[1] = ' ';
            pl = pl + 2;
            mlc = 1;
          }
          else if (((~mlc & 1) == 0 && c == 0x2a) && l == 0x2f) {
            c = l;
            l = fgetc((FILE *)f);
            pl[0] = ' ';
            pl[1] = ' ';
            pl = pl + 2;
            mlc = 0;
            eline = line;
            ecolumn = column;
          }
          else {
            column = column + 1;
            if ((mlc & 1) == 0) {
              *pl = (char)c;
            }
            else {
              *pl = ' ';
            }
            pl = pl + 1;
          }
        }
      }
      else {
        if (c != 9) {
          if (c == 10) {
            if (l == 0xd) {
LAB_00106794:
              c = l;
              l = fgetc((FILE *)f);
            }
          }
          else {
            if (c != 0xd) goto LAB_00106653;
            if (l == 10) goto LAB_00106794;
          }
          *pl = '\n';
          pl = pl + 1;
          break;
        }
        uVar5 = column % tabstop;
        column = (tabstop - uVar5) + column;
        uVar8 = (ulong)(~uVar5 + tabstop);
        memset(pl,0x20,uVar8 + 1);
        pl = pl + uVar8 + 1;
      }
      if (0xfff < column) {
        ccerr(F,"line too long in file \"%s\" at line %d",filnam,(ulong)(uint)line);
      }
    } while (c != -1);
  }
  *pl = '\0';
  ppuVar2 = __ctype_b_loc();
  puVar1 = *ppuVar2;
  pcVar7 = &DAT_0010c80d;
  do {
    pcVar3 = pcVar7 + 3;
    pcVar7 = pcVar7 + 1;
  } while ((*(byte *)((long)puVar1 + (long)*pcVar3 * 2 + 1) & 0x20) != 0);
  if (*pcVar3 == '\0') {
    linebuf[0] = '\n';
    linebuf[1] = '\0';
  }
  else {
    do {
      pcVar3 = pcVar7;
      pcVar7 = pcVar3 + 1;
    } while (pcVar3[2] != '\0');
    cVar4 = *pcVar7;
    pcVar3 = pcVar3 + 2;
    if ((*(byte *)((long)puVar1 + (long)cVar4 * 2 + 1) & 0x20) != 0) {
      do {
        pcVar7 = pcVar3;
        column = column + -1;
        cVar4 = pcVar7[-2];
        pcVar3 = pcVar7 + -1;
      } while ((*(byte *)((long)puVar1 + (long)cVar4 * 2 + 1) & 0x20) != 0);
      pcVar7 = pcVar7 + -2;
    }
    if (cVar4 == '\\') {
      line = line + 1;
      readline(pcVar7);
      update_line = 1;
    }
    else {
      column = column + -1;
      pcVar3[0] = '\n';
      pcVar3[1] = '\0';
    }
  }
  return 1;
}

Assistant:

int readline(char* pl)
{
    if (c == EOF)
        return 0;

    while (c != EOF)
    {
        readbyte();

        if (c == EOF)
        {
            if (mlc)
                err(E, "unterminated comment");

        }
        else if (c == '\n')
        {
            if (l == '\r')
                readbyte();

            *pl++ = '\n';
            break;
        }
        else if (c == '\r')
        {
            if (l == '\n')
                readbyte();

            *pl++ = '\n';
            break;
        }
        else if (c == '\t')
        {
            int sp = tabstop - (column % tabstop);
            column += sp;
            while (sp--)
                *pl++ = ' ';
        }
        /*else if (c == '\v')
        {

        } */
        else if (!mlc && c == '/' && l == '/')
        {
            while (l != '\n' && l != '\r' && l != '\v')
                readbyte();
        }
        else if (!mlc && c == '/' && l == '*')
        {
            readbyte();
            *pl++ = ' ';
            *pl++ = ' ';
            mlc = 1;
        }
        else if (mlc && c == '*' && l == '/')
        {
            readbyte();
            *pl++ = ' ';
            *pl++ = ' ';
            mlc = 0;

            eline = line;
            ecolumn = column;
        }
        else
        {
            ++column;
            if (mlc)
                *pl++ = ' ';
            else
                *pl++ = c;
        }

        if (column >= BUFSIZE)
            ccerr(F, "line too long in file \"%s\" at line %d", filnam, line);
    }
    *pl = 0;
    
    pl = linebuf;
    while (isspace(*pl))
        pl++;
    
    /* empty line ? */
    if (!*pl)
    {
        linebuf[0] = '\n';
        linebuf[1] = 0;
        return 1;
    }
    
    /* search for the last non white character of the line */
    while (*pl)
        ++pl;
    --pl;
    
    while (isspace(*pl))
    {
        --pl;
        --column;
    }
    
    /* merge lines or remove trailing spaces */
    if (*pl == '\\')
    {
        ++line;
        readline(pl);
        update_line = 1;
    }
    else
    {
        --column;
        *++pl = '\n';
        *++pl = 0;
    }
    
    return 1;
}